

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

unique_ptr<Kompositum::Composite,_std::default_delete<Kompositum::Composite>_> __thiscall
Kompositum::make_unique<Kompositum::Composite,unsigned_long&>(Kompositum *this,unsigned_long *args)

{
  Composite *this_00;
  unsigned_long *args_local;
  
  this_00 = (Composite *)operator_new(0x28);
  Composite::Composite(this_00,*args);
  std::unique_ptr<Kompositum::Composite,std::default_delete<Kompositum::Composite>>::
  unique_ptr<std::default_delete<Kompositum::Composite>,void>
            ((unique_ptr<Kompositum::Composite,std::default_delete<Kompositum::Composite>> *)this,
             this_00);
  return (__uniq_ptr_data<Kompositum::Composite,_std::default_delete<Kompositum::Composite>,_true,_true>
          )(__uniq_ptr_data<Kompositum::Composite,_std::default_delete<Kompositum::Composite>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> make_unique(Args&&... args) {
    return std::unique_ptr<T>{new T{std::forward<Args>(args)...}};
}